

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

char * fmt::v11::detail::invoke_parse<char_const(&)[7],char>(parse_context<char> *ctx)

{
  char *pcVar1;
  native_formatter<const_char_*,_char,_(fmt::v11::detail::type)12> local_30;
  
  local_30.specs_.precision_ref.name.size_ = 0;
  local_30.specs_.width_ref.name.data_ = (char *)0x0;
  local_30.specs_.width_ref.name.size_ = 0;
  local_30.specs_.super_format_specs.super_basic_specs.data_ = 0x8000;
  local_30.specs_.super_format_specs.super_basic_specs.fill_data_[0] = ' ';
  local_30.specs_.super_format_specs._9_7_ = 0xffffffff000000;
  local_30.specs_.super_format_specs._5_4_ = 0;
  local_30.specs_.precision_ref.name.data_ = (char *)0x0;
  pcVar1 = native_formatter<const_char_*,_char,_(fmt::v11::detail::type)12>::parse(&local_30,ctx);
  return pcVar1;
}

Assistant:

FMT_CONSTEXPR auto invoke_parse(parse_context<Char>& ctx) -> const Char* {
  using mapped_type = remove_cvref_t<mapped_t<T, Char>>;
  constexpr bool formattable =
      std::is_constructible<formatter<mapped_type, Char>>::value;
  if (!formattable) return ctx.begin();  // Error is reported in the value ctor.
  using formatted_type = conditional_t<formattable, mapped_type, int>;
  return formatter<formatted_type, Char>().parse(ctx);
}